

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gls::BuiltinPrecisionTests::InputLess<tcu::Matrix<float,_3,_2>_>::operator()
          (InputLess<tcu::Matrix<float,_3,_2>_> *this,Matrix<float,_3,_2> *mat1,
          Matrix<float,_3,_2> *mat2)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    uVar3 = uVar2;
    if (uVar2 == 2) goto LAB_0143938a;
    bVar1 = inputLess<tcu::Vector<float,3>>((Vector<float,_3> *)mat1,(Vector<float,_3> *)mat2);
    if (bVar1) {
      uVar3 = 1;
      goto LAB_0143938a;
    }
    bVar1 = inputLess<tcu::Vector<float,3>>((Vector<float,_3> *)mat2,(Vector<float,_3> *)mat1);
    mat2 = (Matrix<float,_3,_2> *)((long)mat2 + 0xc);
    mat1 = (Matrix<float,_3,_2> *)((long)mat1 + 0xc);
    uVar3 = uVar2 + 1;
  } while (!bVar1);
  uVar3 = 0;
LAB_0143938a:
  return (bool)(uVar2 < 2 & (byte)uVar3);
}

Assistant:

bool operator() (const Matrix<T, Rows, Cols>& mat1,
					 const Matrix<T, Rows, Cols>& mat2) const
	{
		for (int col = 0; col < Cols; ++col)
		{
			if (inputLess(mat1[col], mat2[col]))
				return true;
			if (inputLess(mat2[col], mat1[col]))
				return false;
		}

		return false;
	}